

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_json.c
# Opt level: O1

int test_json(test_scope *scope,char *json,char *expect,int expect_err,
             flatcc_json_parser_flags_t parse_flags,flatcc_json_printer_flags_t print_flags,int line
             )

{
  FILE *pFVar1;
  int iVar2;
  int iVar3;
  size_t bufsiz;
  void *buf;
  char *pcVar4;
  char *__format;
  size_t buf_size;
  flatcc_json_printer_t printer_ctx;
  flatcc_json_parser_t parser_ctx;
  flatcc_builder_t builder;
  size_t local_270;
  char *local_268;
  size_t local_260;
  flatcc_json_printer_t local_258;
  flatcc_json_parser_t local_208;
  flatcc_builder_t local_1c0;
  
  local_268 = expect;
  flatcc_builder_init(&local_1c0);
  flatcc_json_printer_init_dynamic_buffer(&local_258,0);
  local_258._49_2_ = CONCAT11((char)print_flags,local_258.indent) & 0x1ff;
  local_258.noenum = (byte)(print_flags >> 1) & 1;
  local_258.skip_default = (byte)(print_flags >> 2) & 1;
  local_258.force_default = (byte)(print_flags >> 3) & 1;
  if ((print_flags & 0x10) != 0) {
    local_258.indent = 2;
  }
  if ((print_flags & 0x20) != 0) {
    local_258.indent = '\x02';
    local_258.unquote = '\x01';
    local_258.noenum = 0;
  }
  bufsiz = strlen(json);
  iVar2 = flatcc_json_parser_table_as_root
                    (&local_1c0,&local_208,json,bufsiz,parse_flags,scope->identifier,scope->parser);
  pFVar1 = _stderr;
  if (iVar2 == expect_err) {
    iVar2 = 0;
    if (expect_err != 0) {
      buf = (void *)0x0;
      goto LAB_001076aa;
    }
    buf = flatcc_builder_finalize_aligned_buffer(&local_1c0,&local_270);
    iVar3 = flatcc_verify_table_as_root(buf,local_270,scope->identifier,scope->verifier);
    pFVar1 = _stderr;
    if (iVar3 == 0) {
      flatcc_json_printer_table_as_root(&local_258,buf,local_270,scope->identifier,scope->printer);
      pcVar4 = (char *)flatcc_json_printer_get_buffer(&local_258,&local_260);
      if (pcVar4 != (char *)0x0) {
        iVar3 = strcmp(local_268,pcVar4);
        if (iVar3 == 0) goto LAB_001076aa;
      }
      test_json_cold_2();
    }
    else {
      pcVar4 = flatcc_verify_error_string(iVar3);
      fprintf(pFVar1,"%s:%d: buffer verification failed: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/json_test/test_json.c"
              ,(ulong)(uint)line,pcVar4);
    }
  }
  else {
    if (expect_err == 0) {
      pcVar4 = flatcc_json_parser_error_string(iVar2);
      __format = "%d: json test: parse failed: %s\n";
LAB_001075f1:
      fprintf(pFVar1,__format,(ulong)(uint)line,pcVar4);
    }
    else {
      if (iVar2 == 0) {
        pcVar4 = flatcc_json_parser_error_string(expect_err);
        __format = "%d: json test: parse successful, but expected to fail with: %s\n";
        goto LAB_001075f1;
      }
      test_json_cold_1();
    }
    iVar2 = 0;
    fprintf(_stderr,"%s\n",json);
    if (1 < local_208.pos) {
      do {
        fputc(0x20,_stderr);
        iVar2 = iVar2 + 1;
      } while (iVar2 < local_208.pos + -1);
    }
    fwrite("^\n",2,1,_stderr);
    buf = (void *)0x0;
  }
  iVar2 = -1;
  if (buf != (void *)0x0) {
    test_json_cold_3();
  }
LAB_001076aa:
  flatcc_builder_aligned_free(buf);
  flatcc_builder_clear(&local_1c0);
  flatcc_json_printer_clear(&local_258);
  return iVar2;
}

Assistant:

int test_json(const struct test_scope *scope, char *json,
        char *expect, int expect_err,
        flatcc_json_parser_flags_t parse_flags, flatcc_json_printer_flags_t print_flags, int line)
{
    int ret = -1;
    int err;
    void *flatbuffer = 0;
    char *buf = 0;
    size_t flatbuffer_size, buf_size;
    flatcc_builder_t builder, *B;
    flatcc_json_parser_t parser_ctx;
    flatcc_json_printer_t printer_ctx;
    int i;

    B = &builder;
    flatcc_builder_init(B);
    flatcc_json_printer_init_dynamic_buffer(&printer_ctx, 0);
    flatcc_json_printer_set_flags(&printer_ctx, print_flags);
    err = flatcc_json_parser_table_as_root(B, &parser_ctx, json, strlen(json), parse_flags,
            scope->identifier, scope->parser);
    if (err != expect_err) {
        if (expect_err) {
            if (err) {
                fprintf(stderr, "%d: json test: parse failed with: %s\n",
                        line, flatcc_json_parser_error_string(err));
                fprintf(stderr, "but expected to fail with: %s\n",
                        flatcc_json_parser_error_string(expect_err));
                fprintf(stderr, "%s\n", json);
            } else {
                fprintf(stderr, "%d: json test: parse successful, but expected to fail with: %s\n",
                        line, flatcc_json_parser_error_string(expect_err));
                fprintf(stderr, "%s\n", json);
            }
        } else {
            fprintf(stderr, "%d: json test: parse failed: %s\n", line, flatcc_json_parser_error_string(err));
            fprintf(stderr, "%s\n", json);
        }
        for (i = 0; i < parser_ctx.pos - 1; ++i) {
            fprintf(stderr, " ");
        }
        fprintf(stderr, "^\n");
        goto failed;
    }
    if (expect_err) {
        ret = 0;
        goto done;
    }
    flatbuffer = flatcc_builder_finalize_aligned_buffer(B, &flatbuffer_size);
    if ((ret = flatcc_verify_table_as_root(flatbuffer, flatbuffer_size, scope->identifier, scope->verifier))) {
        fprintf(stderr, "%s:%d: buffer verification failed: %s\n",
                __FILE__, line, flatcc_verify_error_string(ret));
        goto failed;
    }

    flatcc_json_printer_table_as_root(&printer_ctx, flatbuffer, flatbuffer_size, scope->identifier, scope->printer);
    buf = flatcc_json_printer_get_buffer(&printer_ctx, &buf_size);
    if (!buf || strcmp(expect, buf)) {
        fprintf(stderr, "%d: json test: printed buffer not as expected, got:\n", line);
        fprintf(stderr, "%s\n", buf);
        fprintf(stderr, "expected:\n");
        fprintf(stderr, "%s\n", expect);
        goto failed;
    }
    ret = 0;

done:
    flatcc_builder_aligned_free(flatbuffer);
    flatcc_builder_clear(B);
    flatcc_json_printer_clear(&printer_ctx);
    return ret;

failed:
    if (flatbuffer) {
        hexdump("parsed buffer", flatbuffer, flatbuffer_size, stderr);
    }
    ret = -1;
    goto done;
}